

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_sinc.c
# Opt level: O1

SRC_ERROR sinc_multichan_vari_process(SRC_STATE *state,SRC_DATA *data)

{
  double *__s;
  double *__s_00;
  float fVar1;
  float fVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  SINC_FILTER *filter;
  float *pfVar7;
  float *pfVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  SRC_ERROR SVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  int iVar21;
  ulong uVar22;
  double dVar23;
  undefined1 auVar24 [16];
  double dVar25;
  double dVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  double dVar29;
  double dVar30;
  undefined1 auVar31 [16];
  
  filter = (SINC_FILTER *)state->private_data;
  if (filter == (SINC_FILTER *)0x0) {
    SVar11 = SRC_ERR_NO_PRIVATE;
  }
  else {
    iVar17 = state->channels;
    filter->in_count = data->input_frames * (long)iVar17;
    filter->out_count = data->output_frames * (long)iVar17;
    filter->out_gen = 0;
    filter->in_used = 0;
    dVar26 = state->last_ratio;
    SVar11 = SRC_ERR_BAD_INTERNAL_STATE;
    if ((0.00390625 <= dVar26) && (dVar26 <= 256.0)) {
      dVar23 = dVar26;
      if (data->src_ratio <= dVar26) {
        dVar23 = data->src_ratio;
      }
      dVar25 = state->last_position;
      dVar30 = dVar25 - (double)(int)ROUND(dVar25);
      dVar30 = (double)(~-(ulong)(dVar30 < 0.0) & (ulong)dVar30 |
                       (ulong)(dVar30 + 1.0) & -(ulong)(dVar30 < 0.0));
      auVar31._8_8_ = 0;
      auVar31._0_8_ = dVar30;
      filter->b_current = ((int)ROUND(dVar25 - dVar30) * iVar17 + filter->b_current) % filter->b_len
      ;
      if (filter->out_gen < filter->out_count) {
        dVar25 = ((double)filter->coeff_half_len + 2.0) / (double)filter->index_inc;
        iVar17 = ((int)ROUND((double)(-(ulong)(dVar23 < 1.0) & (ulong)(dVar25 / dVar23) |
                                     ~-(ulong)(dVar23 < 1.0) & (ulong)dVar25)) + 1) * iVar17;
        dVar23 = 1.0 / dVar26;
        __s = filter->left_calc;
        __s_00 = filter->right_calc;
        do {
          dVar30 = auVar31._0_8_;
          if (((filter->b_end - filter->b_current) + filter->b_len) % filter->b_len <= iVar17) {
            SVar11 = prepare_data(filter,state->channels,data,iVar17);
            state->error = SVar11;
            if (SVar11 != SRC_ERR_NO_ERROR) {
              return SVar11;
            }
            if (((filter->b_end - filter->b_current) + filter->b_len) % filter->b_len <= iVar17)
            break;
          }
          if ((-1 < filter->b_real_end) &&
             ((double)filter->b_real_end <= (double)filter->b_current + dVar30 + dVar23 + 1e-20))
          break;
          if (0 < filter->out_count) {
            dVar25 = state->last_ratio;
            if (1e-10 < ABS(dVar25 - data->src_ratio)) {
              dVar26 = ((data->src_ratio - dVar25) * (double)filter->out_gen) /
                       (double)filter->out_count + dVar25;
            }
          }
          iVar3 = filter->index_inc;
          uVar27 = SUB84(dVar26,0);
          uVar28 = (undefined4)((ulong)dVar26 >> 0x20);
          if (1.0 <= dVar26) {
            uVar27 = 0;
            uVar28 = 0x3ff00000;
          }
          dVar25 = (double)CONCAT44(uVar28,uVar27) * (double)iVar3;
          uVar19 = (uint)ROUND(dVar25 * 4096.0);
          iVar21 = (int)ROUND(dVar30 * dVar25 * 4096.0);
          uVar4 = state->channels;
          uVar22 = (ulong)uVar4;
          lVar20 = filter->out_gen;
          pfVar7 = data->data_out;
          iVar5 = filter->coeff_half_len;
          iVar12 = (iVar5 * 0x1000 - iVar21) / (int)uVar19;
          uVar18 = iVar12 * uVar19 + iVar21;
          iVar6 = filter->b_current;
          uVar16 = iVar6 - iVar12 * uVar4;
          if ((int)uVar16 < 0) {
            if ((((int)uVar4 < 1) || (uVar14 = (~uVar16 + uVar4) / uVar4, (int)uVar19 < 1)) ||
               ((int)uVar18 < 0)) {
              __assert_fail("divident >= 0 && divisor > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                            ,0xa0,"int int_div_ceil(int, int)");
            }
            if (((uVar19 + uVar18) - 1) / uVar19 < uVar14) {
              __assert_fail("steps <= int_div_ceil (filter_index, increment)",
                            "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                            ,0x3f4,
                            "void calc_output_multi(SINC_FILTER *, increment_t, increment_t, int, double, float *)"
                           );
            }
            uVar18 = uVar18 - uVar14 * uVar19;
            uVar16 = uVar4 * uVar14 + uVar16;
          }
          memset(__s,0,(long)(int)uVar4 * 8);
          for (; -1 < (int)uVar18; uVar18 = uVar18 - uVar19) {
            uVar14 = uVar18 >> 0xc;
            if (iVar5 < (int)uVar14) {
              __assert_fail("indx >= 0 && indx + 1 < filter->coeff_half_len + 2",
                            "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                            ,0x3fe,
                            "void calc_output_multi(SINC_FILTER *, increment_t, increment_t, int, double, float *)"
                           );
            }
            if (((int)uVar16 < 0) || (uVar13 = uVar16 + uVar4, filter->b_len < (int)uVar13)) {
              __assert_fail("data_index >= 0 && data_index + channels - 1 < filter->b_len",
                            "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                            ,0x401,
                            "void calc_output_multi(SINC_FILTER *, increment_t, increment_t, int, double, float *)"
                           );
            }
            if (filter->b_end < (int)uVar13) {
              __assert_fail("data_index + channels - 1 < filter->b_end",
                            "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                            ,0x402,
                            "void calc_output_multi(SINC_FILTER *, increment_t, increment_t, int, double, float *)"
                           );
            }
            if (0 < (int)uVar4) {
              fVar1 = filter->coeffs[uVar14];
              fVar2 = filter->coeffs[(ulong)uVar14 + 1];
              pfVar8 = filter->buffer;
              uVar15 = 0;
              do {
                __s[uVar15] = (double)pfVar8[uVar16 + uVar15] *
                              ((double)(uVar18 & 0xfff) * 0.000244140625 * (double)(fVar2 - fVar1) +
                              (double)fVar1) + __s[uVar15];
                uVar15 = uVar15 + 1;
              } while (uVar22 != uVar15);
            }
            uVar16 = uVar13;
          }
          iVar12 = (int)(iVar5 * 0x1000 - (uVar19 - iVar21)) / (int)uVar19;
          uVar16 = (iVar12 + 1) * uVar4 + iVar6;
          memset(__s_00,0,(long)(int)uVar4 * 8);
          uVar18 = iVar12 * uVar19 + (uVar19 - iVar21);
          do {
            uVar14 = (int)uVar18 >> 0xc;
            if (((int)uVar14 < 0) || (iVar5 < (int)uVar14)) {
              __assert_fail("indx >= 0 && indx + 1 < filter->coeff_half_len + 2",
                            "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                            ,0x414,
                            "void calc_output_multi(SINC_FILTER *, increment_t, increment_t, int, double, float *)"
                           );
            }
            if ((int)uVar16 < 0) {
LAB_00105168:
              __assert_fail("data_index >= 0 && data_index + channels - 1 < filter->b_len",
                            "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                            ,0x416,
                            "void calc_output_multi(SINC_FILTER *, increment_t, increment_t, int, double, float *)"
                           );
            }
            iVar6 = filter->b_len;
            if (iVar6 < (int)(uVar4 + uVar16)) goto LAB_00105168;
            if (filter->b_end < (int)(uVar4 + uVar16)) {
              __assert_fail("data_index + channels - 1 < filter->b_end",
                            "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                            ,0x417,
                            "void calc_output_multi(SINC_FILTER *, increment_t, increment_t, int, double, float *)"
                           );
            }
            if (0 < (int)uVar4) {
              fVar1 = filter->coeffs[uVar14];
              fVar2 = filter->coeffs[(ulong)uVar14 + 1];
              pfVar8 = filter->buffer;
              uVar15 = 0;
              do {
                __s_00[uVar15] =
                     (double)pfVar8[uVar16 + uVar15] *
                     ((double)(uVar18 & 0xfff) * 0.000244140625 * (double)(fVar2 - fVar1) +
                     (double)fVar1) + __s_00[uVar15];
                uVar15 = uVar15 + 1;
              } while (uVar22 != uVar15);
            }
            uVar16 = uVar16 - uVar4;
            uVar14 = uVar18 - uVar19;
            bVar9 = (int)uVar19 <= (int)uVar18;
            uVar18 = uVar14;
          } while (uVar14 != 0 && bVar9);
          if (0 < (int)uVar4) {
            uVar15 = 0;
            do {
              pfVar7[lVar20 + uVar15] =
                   (float)((filter->left_calc[uVar15] + __s_00[uVar15]) * (dVar25 / (double)iVar3));
              uVar15 = uVar15 + 1;
            } while (uVar22 != uVar15);
          }
          iVar3 = state->channels;
          lVar20 = (long)iVar3 + filter->out_gen;
          dVar29 = dVar30 + 1.0 / dVar26;
          dVar25 = dVar29 - (double)(int)ROUND(dVar29);
          auVar24._0_8_ = ~-(ulong)(dVar25 < 0.0) & (ulong)dVar25;
          auVar24._8_8_ = 0;
          auVar10._8_4_ = auVar31._8_4_;
          auVar10._0_8_ = (ulong)(dVar25 + 1.0) & -(ulong)(dVar25 < 0.0);
          auVar10._12_4_ = auVar31._12_4_;
          auVar31 = auVar24 | auVar10;
          dVar30 = auVar31._0_8_;
          filter->out_gen = lVar20;
          filter->b_current = ((int)ROUND(dVar29 - dVar30) * iVar3 + filter->b_current) % iVar6;
        } while (lVar20 < filter->out_count);
      }
      state->last_position = dVar30;
      state->last_ratio = dVar26;
      iVar17 = state->channels;
      data->input_frames_used = filter->in_used / (long)iVar17;
      data->output_frames_gen = filter->out_gen / (long)iVar17;
      SVar11 = SRC_ERR_NO_ERROR;
    }
  }
  return SVar11;
}

Assistant:

static SRC_ERROR
sinc_multichan_vari_process (SRC_STATE *state, SRC_DATA *data)
{	SINC_FILTER *filter ;
	double		input_index, src_ratio, count, float_increment, terminate, rem ;
	increment_t	increment, start_filter_index ;
	int			half_filter_chan_len, samples_in_hand ;

	if (state->private_data == NULL)
		return SRC_ERR_NO_PRIVATE ;

	filter = (SINC_FILTER*) state->private_data ;

	/* If there is not a problem, this will be optimised out. */
	if (sizeof (filter->buffer [0]) != sizeof (data->data_in [0]))
		return SRC_ERR_SIZE_INCOMPATIBILITY ;

	filter->in_count = data->input_frames * state->channels ;
	filter->out_count = data->output_frames * state->channels ;
	filter->in_used = filter->out_gen = 0 ;

	src_ratio = state->last_ratio ;

	if (is_bad_src_ratio (src_ratio))
		return SRC_ERR_BAD_INTERNAL_STATE ;

	/* Check the sample rate ratio wrt the buffer len. */
	count = (filter->coeff_half_len + 2.0) / filter->index_inc ;
	if (MIN (state->last_ratio, data->src_ratio) < 1.0)
		count /= MIN (state->last_ratio, data->src_ratio) ;

	/* Maximum coefficientson either side of center point. */
	half_filter_chan_len = state->channels * (int) (psf_lrint (count) + 1) ;

	input_index = state->last_position ;

	rem = fmod_one (input_index) ;
	filter->b_current = (filter->b_current + state->channels * psf_lrint (input_index - rem)) % filter->b_len ;
	input_index = rem ;

	terminate = 1.0 / src_ratio + 1e-20 ;

	/* Main processing loop. */
	while (filter->out_gen < filter->out_count)
	{
		/* Need to reload buffer? */
		samples_in_hand = (filter->b_end - filter->b_current + filter->b_len) % filter->b_len ;

		if (samples_in_hand <= half_filter_chan_len)
		{	if ((state->error = prepare_data (filter, state->channels, data, half_filter_chan_len)) != 0)
				return state->error ;

			samples_in_hand = (filter->b_end - filter->b_current + filter->b_len) % filter->b_len ;
			if (samples_in_hand <= half_filter_chan_len)
				break ;
			} ;

		/* This is the termination condition. */
		if (filter->b_real_end >= 0)
		{	if (filter->b_current + input_index + terminate >= filter->b_real_end)
				break ;
			} ;

		if (filter->out_count > 0 && fabs (state->last_ratio - data->src_ratio) > 1e-10)
			src_ratio = state->last_ratio + filter->out_gen * (data->src_ratio - state->last_ratio) / filter->out_count ;

		float_increment = filter->index_inc * (src_ratio < 1.0 ? src_ratio : 1.0) ;
		increment = double_to_fp (float_increment) ;

		start_filter_index = double_to_fp (input_index * float_increment) ;

		calc_output_multi (filter, increment, start_filter_index, state->channels, float_increment / filter->index_inc, data->data_out + filter->out_gen) ;
		filter->out_gen += state->channels ;

		/* Figure out the next index. */
		input_index += 1.0 / src_ratio ;
		rem = fmod_one (input_index) ;

		filter->b_current = (filter->b_current + state->channels * psf_lrint (input_index - rem)) % filter->b_len ;
		input_index = rem ;
		} ;

	state->last_position = input_index ;

	/* Save current ratio rather then target ratio. */
	state->last_ratio = src_ratio ;

	data->input_frames_used = filter->in_used / state->channels ;
	data->output_frames_gen = filter->out_gen / state->channels ;

	return SRC_ERR_NO_ERROR ;
}